

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

void __thiscall
cfgfile::parser_t<cfgfile::string_trait_t>::parser_t
          (parser_t<cfgfile::string_trait_t> *this,tag_t<cfgfile::string_trait_t> *tag,
          input_stream_t<cfgfile::string_trait_t> *stream)

{
  _Head_base<0UL,_cfgfile::details::parser_base_t<cfgfile::string_trait_t>_*,_false> _Var1;
  parser_base_t<cfgfile::string_trait_t> *in_RAX;
  _Head_base<0UL,_cfgfile::details::parser_base_t<cfgfile::string_trait_t>_*,_false> local_18;
  
  local_18._M_head_impl = in_RAX;
  std::
  make_unique<cfgfile::details::parser_conffile_impl_t<cfgfile::string_trait_t>,cfgfile::tag_t<cfgfile::string_trait_t>&,cfgfile::input_stream_t<cfgfile::string_trait_t>&>
            ((tag_t<cfgfile::string_trait_t> *)&stack0xffffffffffffffe8,
             (input_stream_t<cfgfile::string_trait_t> *)tag);
  _Var1._M_head_impl = local_18._M_head_impl;
  local_18._M_head_impl = (parser_base_t<cfgfile::string_trait_t> *)0x0;
  (this->m_d)._M_t.
  super___uniq_ptr_impl<cfgfile::details::parser_base_t<cfgfile::string_trait_t>,_std::default_delete<cfgfile::details::parser_base_t<cfgfile::string_trait_t>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_cfgfile::details::parser_base_t<cfgfile::string_trait_t>_*,_std::default_delete<cfgfile::details::parser_base_t<cfgfile::string_trait_t>_>_>
  .super__Head_base<0UL,_cfgfile::details::parser_base_t<cfgfile::string_trait_t>_*,_false>.
  _M_head_impl = _Var1._M_head_impl;
  std::
  unique_ptr<cfgfile::details::parser_conffile_impl_t<cfgfile::string_trait_t>,_std::default_delete<cfgfile::details::parser_conffile_impl_t<cfgfile::string_trait_t>_>_>
  ::~unique_ptr((unique_ptr<cfgfile::details::parser_conffile_impl_t<cfgfile::string_trait_t>,_std::default_delete<cfgfile::details::parser_conffile_impl_t<cfgfile::string_trait_t>_>_>
                 *)&stack0xffffffffffffffe8);
  return;
}

Assistant:

parser_t( tag_t< Trait > & tag, input_stream_t< Trait > & stream )
		:	m_d( std::make_unique< details::parser_conffile_impl_t< Trait > >
				( tag, stream ) )
	{
	}